

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O3

WidthVector * __thiscall
KDReports::TableBreakingLogic::widthPerPage
          (WidthVector *__return_storage_ptr__,TableBreakingLogic *this,QVector<int> *colPerPage)

{
  uint uVar1;
  int iVar2;
  qsizetype size;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  reference pdVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  QArrayDataPointer<double> *unaff_RBX;
  long i;
  double dVar9;
  
  size = (colPerPage->d).size;
  if (this->m_pages < size) {
LAB_0014e5d6:
    widthPerPage();
    QArrayDataPointer<double>::~QArrayDataPointer(unaff_RBX);
    _Unwind_Resume(extraout_RAX);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (double *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<double>::resize(__return_storage_ptr__,size);
  if (0 < (colPerPage->d).size) {
    i = 0;
    uVar5 = 0;
    do {
      iVar2 = (colPerPage->d).ptr[i];
      uVar1 = iVar2 + uVar5;
      if (iVar2 < 1) {
        dVar9 = 0.0;
      }
      else {
        uVar3 = (this->m_widths).d.size;
        uVar6 = (ulong)(int)uVar5;
        uVar8 = 0;
        if (uVar6 <= uVar3) {
          uVar8 = uVar3 - uVar6;
        }
        uVar4 = uVar5 + 1;
        if ((int)(uVar5 + 1) < (int)uVar1) {
          uVar4 = uVar1;
        }
        if (uVar8 <= ~uVar5 + uVar4) {
          widthPerPage();
          unaff_RBX = &__return_storage_ptr__->d;
          goto LAB_0014e5d6;
        }
        dVar9 = 0.0;
        do {
          dVar9 = dVar9 + (this->m_widths).d.ptr[uVar6];
          uVar6 = uVar6 + 1;
        } while ((long)uVar6 < (long)(int)uVar1);
      }
      pdVar7 = QList<double>::operator[](__return_storage_ptr__,i);
      *pdVar7 = dVar9;
      i = i + 1;
      uVar5 = uVar1;
    } while (i < (colPerPage->d).size);
  }
  return __return_storage_ptr__;
}

Assistant:

TableBreakingLogic::WidthVector TableBreakingLogic::widthPerPage(const QVector<int> &colPerPage) const
{
    Q_ASSERT(colPerPage.size() <= m_pages);
    int startColumn = 0;
    WidthVector widths;
    widths.resize(colPerPage.size());
    for (int page = 0; page < colPerPage.size(); ++page) {
        const int numColumnsForPage = colPerPage[page];
        qreal pageTotalWidth = 0;
        for (int i = startColumn; i < startColumn + numColumnsForPage; ++i) {
            pageTotalWidth += m_widths[i];
        }
        startColumn += numColumnsForPage;
        widths[page] = pageTotalWidth;
    }
    return widths;
}